

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall
wallet::DescriptorScriptPubKeyMan::ReturnDestination
          (DescriptorScriptPubKeyMan *this,int64_t index,bool internal,CTxDestination *addr)

{
  byte bVar1;
  WalletBatch *this_00;
  WalletBatch *in_RCX;
  byte in_DL;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock58;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  WalletDatabase *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  uint256 *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RSI,(AnnotatedMixin<std::recursive_mutex> *)
                    CONCAT17(bVar1,in_stack_ffffffffffffffa0),(char *)in_RCX,
             (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
             SUB41((uint)in_stack_ffffffffffffff88 >> 0x18,0));
  if ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)(long)((int)in_RDI[0x34] + -1) == in_RSI)
  {
    *(int *)(in_RDI + 0x34) = (int)in_RDI[0x34] + -1;
  }
  this_00 = (WalletBatch *)(**(code **)(*(long *)in_RDI[1] + 0x18))();
  WalletBatch::WalletBatch(this_00,in_stack_ffffffffffffff70,(bool)in_stack_ffffffffffffff6f);
  (**(code **)(*in_RDI + 0xd0))(local_28);
  WalletBatch::WriteDescriptor
            (in_RCX,in_stack_ffffffffffffff90,
             (WalletDescriptor *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()((signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
                *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DescriptorScriptPubKeyMan::ReturnDestination(int64_t index, bool internal, const CTxDestination& addr)
{
    LOCK(cs_desc_man);
    // Only return when the index was the most recent
    if (m_wallet_descriptor.next_index - 1 == index) {
        m_wallet_descriptor.next_index--;
    }
    WalletBatch(m_storage.GetDatabase()).WriteDescriptor(GetID(), m_wallet_descriptor);
    NotifyCanGetAddressesChanged();
}